

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.h
# Opt level: O0

int __thiscall
CCommandManager::Filter
          (CCommandManager *this,array<bool,_allocator_default<bool>_> *aFilter,char *pStr,
          bool Exact)

{
  int iVar1;
  int iVar2;
  bool *pbVar3;
  CCommand *pCVar4;
  CCommand *pCVar5;
  byte in_CL;
  char *in_RDX;
  array<bool,_allocator_default<bool>_> *in_RSI;
  array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_> *in_RDI;
  byte bVar6;
  int i_2;
  int i_1;
  int Filtered;
  int i;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_4;
  
  array<bool,_allocator_default<bool>_>::size(in_RSI);
  array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_>::size(in_RDI);
  dbg_assert_imp(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
                 (char *)0x154519);
  if (*in_RDX == '\0') {
    local_28 = 0;
    while (iVar2 = local_28, iVar1 = array<bool,_allocator_default<bool>_>::size(in_RSI),
          iVar2 < iVar1) {
      pbVar3 = array<bool,_allocator_default<bool>_>::operator[](in_RSI,local_28);
      *pbVar3 = false;
      local_28 = local_28 + 1;
    }
    local_4 = 0;
  }
  else {
    local_2c = 0;
    if ((in_CL & 1) == 0) {
      local_34 = 0;
      while (iVar2 = local_34,
            iVar1 = array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_>
                    ::size(in_RDI), iVar2 < iVar1) {
        array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_>::operator[]
                  (in_RDI,local_34);
        pCVar4 = (CCommand *)
                 str_find_nocase((char *)CONCAT44(in_stack_ffffffffffffffbc,
                                                  in_stack_ffffffffffffffb8),
                                 (char *)CONCAT44(in_stack_ffffffffffffffb4,iVar2));
        pCVar5 = array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_>::
                 operator[](in_RDI,local_34);
        pbVar3 = array<bool,_allocator_default<bool>_>::operator[](in_RSI,local_34);
        *pbVar3 = pCVar4 != pCVar5;
        local_2c = (uint)(pCVar4 != pCVar5) + local_2c;
        local_34 = local_34 + 1;
      }
    }
    else {
      local_30 = 0;
      while (iVar2 = local_30,
            iVar1 = array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_>
                    ::size(in_RDI), iVar2 < iVar1) {
        array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_>::operator[]
                  (in_RDI,local_30);
        iVar2 = str_comp(in_stack_ffffffffffffffa0,
                         (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        bVar6 = iVar2 != 0;
        pbVar3 = array<bool,_allocator_default<bool>_>::operator[](in_RSI,local_30);
        *pbVar3 = (bool)(bVar6 & 1);
        local_2c = (uint)(bVar6 & 1) + local_2c;
        local_30 = local_30 + 1;
      }
    }
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

int Filter(array<bool> &aFilter, const char *pStr, bool Exact)
    {
        dbg_assert(aFilter.size() == m_aCommands.size(), "filter size must match command count");
        if(!*pStr)
        {
            for(int i = 0; i < aFilter.size(); i++)
                aFilter[i] = false;
            return 0;
        }

        int Filtered = 0;
        if(Exact)
        {
            for(int i = 0; i < m_aCommands.size(); i++)
                Filtered += (aFilter[i] = str_comp(m_aCommands[i].m_aName, pStr));
        }
        else
        {
            for(int i = 0; i < m_aCommands.size(); i++)
                Filtered += (aFilter[i] = str_find_nocase(m_aCommands[i].m_aName, pStr) != m_aCommands[i].m_aName);
        }

        return Filtered;
    }